

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::write<(moira::Core)1,(moira::AddrSpace)1,4,64ull>(Moira *this,u32 addr,u32 val)

{
  bool bVar1;
  
  this->fcl = '\x01';
  if ((this->flags & 0x100) != 0) {
    bVar1 = Debugger::watchpointMatches(&this->debugger,addr,4);
    if (bVar1) {
      (*this->_vptr_Moira[0x16])(this,addr);
    }
  }
  (*this->_vptr_Moira[8])(this,(ulong)(addr & 0xffffff),(ulong)(val >> 0x10));
  (*this->_vptr_Moira[8])(this,(ulong)(addr + 2 & 0xffffff),(ulong)(val & 0xffff));
  return;
}

Assistant:

void
Moira::write(u32 addr, u32 val)
{
    // Update function code pins
    setFC(AS == AddrSpace::DATA ? FC::USER_DATA : FC::USER_PROG);
    SYNC(2);

    // Check for address errors
    if (misaligned<C, S>(addr)) {
        throw AddressError(makeFrame<F|AE_WRITE>(addr));
    }

    // Check if a watchpoint has been reached
    if ((flags & State::CHECK_WP) && debugger.watchpointMatches(addr, S)) {
        didReachWatchpoint(addr);
    }

    if constexpr (S == Byte) {

        if (F & POLL) POLL_IPL;
        write8(addr & addrMask<C>(), (u8)val);
        SYNC(2);
    }

    if constexpr (S == Word) {

        if (F & POLL) POLL_IPL;
        write16(addr & addrMask<C>(), (u16)val);
        SYNC(2);
    }

    if constexpr (S == Long) {

        if (F & REVERSE) {

            write16((addr + 2) & addrMask<C>(), u16(val & 0xFFFF));
            SYNC(4);
            if (F & POLL) POLL_IPL;
            write16(addr & addrMask<C>(), u16(val >> 16));
            SYNC(2);

        } else {

            write16(addr & addrMask<C>(), u16(val >> 16));
            SYNC(4);
            if (F & POLL) POLL_IPL;
            write16((addr + 2) & addrMask<C>(), u16(val & 0xFFFF));
            SYNC(2);
        }
    }
}